

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

void __thiscall luna::VM::Concat(VM *this,Value *dst,Value *op1,Value *op2)

{
  String *pSVar1;
  Value *v2;
  undefined8 uVar2;
  undefined8 *in_RCX;
  int iVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  String *in_RDI;
  pair<const_char_*,_int> pVar4;
  pair<const_char_*,_int> pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  State *in_stack_fffffffffffffea0;
  State *this_00;
  VM *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Value *pVVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffff0c;
  RuntimeException *in_stack_ffffffffffffff10;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  undefined8 *local_20;
  undefined8 *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  if ((*(int *)(in_RDX + 1) == 4) && (*(int *)(in_RCX + 1) == 4)) {
    String::GetStdString_abi_cxx11_(in_RDI);
    String::GetCStr((String *)*local_20);
    std::operator+(in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
    pSVar1 = State::GetString(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    *local_10 = pSVar1;
    std::__cxx11::string::~string(local_40);
    std::__cxx11::string::~string(local_60);
  }
  else if ((*(int *)(in_RDX + 1) == 4) && (*(int *)(in_RCX + 1) == 2)) {
    String::GetCStr((String *)*in_RDX);
    (anonymous_namespace)::NumberToStr_abi_cxx11_
              ((Value *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::operator+((char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    pSVar1 = State::GetString(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    *local_10 = pSVar1;
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
  }
  else {
    if ((*(int *)(in_RDX + 1) != 2) || (*(int *)(in_RCX + 1) != 4)) {
      pVar4 = GetCurrentInstructionPos(in_stack_fffffffffffffec0);
      v2 = (Value *)pVar4.first;
      iVar3 = pVar4.second;
      pVVar5 = v2;
      iVar6 = iVar3;
      uVar2 = __cxa_allocate_exception(0x20);
      RuntimeException::RuntimeException
                (in_stack_ffffffffffffff10,(char *)CONCAT44(in_stack_ffffffffffffff0c,iVar6),
                 (int)((ulong)pVVar5 >> 0x20),(Value *)CONCAT44(in_stack_fffffffffffffefc,iVar3),v2,
                 (char *)in_RDI);
      __cxa_throw(uVar2,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
    }
    this_00 = (State *)(in_RDI->super_GCObject)._vptr_GCObject;
    (anonymous_namespace)::NumberToStr_abi_cxx11_
              ((Value *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    String::GetCStr((String *)*local_20);
    std::operator+(in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
    pSVar1 = State::GetString(this_00,in_stack_fffffffffffffe98);
    *local_10 = pSVar1;
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  }
  *(undefined4 *)(local_10 + 1) = 4;
  return;
}

Assistant:

void VM::Concat(Value *dst, Value *op1, Value *op2)
    {
        if (op1->type_ == ValueT_String && op2->type_ == ValueT_String)
        {
            dst->str_ = state_->GetString(op1->str_->GetStdString() +
                                          op2->str_->GetCStr());
        }
        else if (op1->type_ == ValueT_String && op2->type_ == ValueT_Number)
        {
            dst->str_ = state_->GetString(op1->str_->GetCStr() +
                                          NumberToStr(op2));
        }
        else if (op1->type_ == ValueT_Number && op2->type_ == ValueT_String)
        {
            dst->str_ = state_->GetString(NumberToStr(op1) +
                                          op2->str_->GetCStr());
        }
        else
        {
            auto pos = GetCurrentInstructionPos();
            throw RuntimeException(pos.first, pos.second, op1, op2, "concat");
        }

        dst->type_ = ValueT_String;
    }